

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_uri_boolean(char *zFilename,char *zParam,int bDflt)

{
  byte bVar1;
  char *z;
  
  z = sqlite3_uri_parameter(zFilename,zParam);
  if (z == (char *)0x0) {
    bVar1 = bDflt != 0;
  }
  else {
    bVar1 = sqlite3GetBoolean(z,bDflt != 0);
  }
  return (uint)bVar1;
}

Assistant:

SQLITE_API int sqlite3_uri_boolean(const char *zFilename, const char *zParam, int bDflt){
  const char *z = sqlite3_uri_parameter(zFilename, zParam);
  bDflt = bDflt!=0;
  return z ? sqlite3GetBoolean(z, bDflt) : bDflt;
}